

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int usebuffer(int f,int n)

{
  char *local_420;
  char *bufp;
  char bufn [1024];
  int n_local;
  int f_local;
  
  bufn._1020_4_ = n;
  if (curbp->b_altb == (buffer *)0x0) {
    local_420 = eread("Switch to buffer: ",(char *)&bufp,0x400,10);
  }
  else {
    local_420 = eread("Switch to buffer (default %s): ",(char *)&bufp,0x400,0x4a,
                      (curbp->b_altb->b_list).l_name);
  }
  if (local_420 == (char *)0x0) {
    n_local = 2;
  }
  else {
    n_local = usebufname(local_420);
  }
  return n_local;
}

Assistant:

int
usebuffer(int f, int n)
{
	char    bufn[NBUFN], *bufp;

	/* Get buffer to use from user */
	if (curbp->b_altb == NULL)
		bufp = eread("Switch to buffer: ", bufn, NBUFN, EFNEW | EFBUF);
	else
		bufp = eread("Switch to buffer (default %s): ", bufn, NBUFN,
		    EFNUL | EFNEW | EFBUF, curbp->b_altb->b_bname);

	if (bufp == NULL)
		return (ABORT);

	return (usebufname(bufp));
}